

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error ft_open_face_internal
                   (FT_Library library,FT_Open_Args *args,FT_Long face_index,FT_Face_conflict *aface
                   ,FT_Bool test_mac_fonts)

{
  undefined8 *puVar1;
  FT_Face driver;
  FT_Face_Internal pFVar2;
  FT_Bitmap_Size *pFVar3;
  bool bVar4;
  FT_Face_conflict face_00;
  uint uVar5;
  int iVar6;
  FT_Error FVar7;
  FT_ListNode node;
  ulong uVar8;
  short sVar9;
  ulong uVar10;
  FT_Library library_00;
  byte bVar11;
  FT_Stream stream_00;
  FT_Int num_params;
  undefined7 in_register_00000081;
  FT_Parameter *pFVar12;
  FT_Memory pFVar13;
  long lVar14;
  FT_Error FVar15;
  uint uVar16;
  FT_Module *ppFVar17;
  FT_Stream pFVar18;
  FT_Face_conflict *ppFVar19;
  bool bVar20;
  FT_Long local_1d8;
  FT_Long offsets [9];
  undefined1 local_188 [8];
  FT_Open_Args args2;
  FT_Error errors [9];
  undefined8 local_118;
  char *file_names [9];
  char local_c6;
  byte local_c5;
  byte local_c4;
  byte local_c3;
  byte local_c2;
  FT_Stream local_80;
  FT_Stream stream2;
  FT_Stream local_70;
  FT_Face_conflict local_68;
  FT_Face face;
  FT_Stream local_58;
  FT_Stream stream;
  FT_Face_conflict *local_48;
  FT_Library local_40;
  uint local_38;
  uint local_34;
  
  local_70 = (FT_Stream)CONCAT44(local_70._4_4_,(int)CONCAT71(in_register_00000081,test_mac_fonts));
  local_58 = (FT_Stream)0x0;
  local_68 = (FT_Face)0x0;
  if (args == (FT_Open_Args *)0x0) {
    return 6;
  }
  if (-1 < face_index && aface == (FT_Face_conflict *)0x0) {
    return 6;
  }
  if ((args->flags & 2) == 0) {
    bVar20 = false;
  }
  else {
    bVar20 = args->stream != (FT_Stream)0x0;
  }
  local_48 = aface;
  uVar5 = FT_Stream_New(library,args,&local_58);
  ppFVar19 = local_48;
  uVar16 = (uint)bVar20;
  stream = (FT_Stream)args;
  local_40 = library;
  local_34 = uVar16;
  if (uVar5 == 0) {
    stream2 = (FT_Stream)library->memory;
    local_38 = uVar5;
    if (((args->flags & 8) == 0) || (face = (FT_Face)args->driver, face == (FT_Face)0x0)) {
      uVar16 = library->num_modules;
      face = (FT_Face)0x0;
      uVar5 = 0xb;
      for (ppFVar17 = library->modules; ppFVar17 < library->modules + uVar16;
          ppFVar17 = ppFVar17 + 1) {
        driver = (FT_Face)*ppFVar17;
        if ((((FT_ModuleRec *)&driver->num_faces)->clazz->module_flags & 1) != 0) {
          if (((ulong)stream->base & 0x10) == 0) {
            pFVar12 = (FT_Parameter *)0x0;
            pFVar13 = (FT_Memory)0x0;
          }
          else {
            pFVar12 = (FT_Parameter *)(ulong)*(uint *)&stream->close;
            pFVar13 = stream->memory;
          }
          face = driver;
          uVar5 = open_face((FT_Driver)driver,&local_58,(FT_Bool)local_34,face_index,(FT_Int)pFVar12
                            ,(FT_Parameter *)pFVar13,&local_68);
          if (uVar5 == 0) {
            local_38 = 0;
            ppFVar19 = local_48;
            goto LAB_001eb08d;
          }
          if ((((char)local_70 != '\0') &&
              (iVar6 = strcmp((*ppFVar17)->clazz->module_name,"truetype"), stream_00 = local_58,
              (char)uVar5 == -0x72)) && (iVar6 == 0)) {
            uVar5 = FT_Stream_Seek(local_58,0);
            if (uVar5 != 0) break;
            uVar5 = open_face_PS_from_sfnt_stream
                              (local_40,stream_00,face_index,(FT_Int)local_48,pFVar12,
                               (FT_Face_conflict *)pFVar13);
            if (uVar5 == 0) goto LAB_001eafd0;
          }
          if ((char)uVar5 != '\x02') break;
        }
      }
      goto LAB_001ead61;
    }
    if ((((FT_ModuleRec *)&face->num_faces)->clazz->module_flags & 1) == 0) {
      local_38 = 0x20;
    }
    else {
      if ((args->flags & 0x10) == 0) {
        num_params = 0;
        pFVar12 = (FT_Parameter *)0x0;
      }
      else {
        num_params = args->num_params;
        pFVar12 = args->params;
      }
      local_38 = open_face((FT_Driver)face,&local_58,bVar20,face_index,num_params,pFVar12,&local_68)
      ;
      if (local_38 == 0) {
LAB_001eb08d:
        node = (FT_ListNode)ft_mem_alloc((FT_Memory)stream2,0x18,(FT_Error *)&local_38);
        face_00 = local_68;
        if (local_38 == 0) {
          node->data = local_68;
          FT_List_Add(&local_68->driver->faces_list,node);
          if (-1 < face_index) {
            uVar16 = FT_New_GlyphSlot(face_00,(FT_GlyphSlot *)0x0);
            if ((uVar16 != 0) || (uVar16 = FT_New_Size(face_00,(FT_Size *)&local_118), uVar16 != 0))
            goto LAB_001eb100;
            face_00->size =
                 (FT_Size)CONCAT62(local_118._2_6_,CONCAT11(local_118._1_1_,(FT_Byte)local_118));
          }
          uVar8 = face_00->face_flags;
          if ((uVar8 & 1) != 0) {
            sVar9 = face_00->height;
            if (sVar9 < 0) {
              sVar9 = -sVar9;
              face_00->height = sVar9;
            }
            if ((uVar8 & 0x20) == 0) {
              face_00->max_advance_height = sVar9;
            }
          }
          if ((uVar8 & 2) != 0) {
            uVar10 = 0;
            uVar8 = (ulong)(uint)face_00->num_fixed_sizes;
            if (face_00->num_fixed_sizes < 1) {
              uVar8 = uVar10;
            }
            for (; uVar8 * 0x20 != uVar10; uVar10 = uVar10 + 0x20) {
              pFVar3 = face_00->available_sizes;
              sVar9 = *(short *)((long)&pFVar3->height + uVar10);
              if (sVar9 < 0) {
                sVar9 = -sVar9;
                *(short *)((long)&pFVar3->height + uVar10) = sVar9;
                bVar11 = (byte)((ushort)sVar9 >> 0xf);
              }
              else {
                bVar11 = 0;
              }
              lVar14 = *(long *)((long)&pFVar3->x_ppem + uVar10);
              if (lVar14 < 0) {
                *(long *)((long)&pFVar3->x_ppem + uVar10) = -lVar14;
              }
              lVar14 = *(long *)((long)&pFVar3->y_ppem + uVar10);
              if (lVar14 < 0) {
                *(long *)((long)&pFVar3->y_ppem + uVar10) = -lVar14;
              }
              if (bVar11 != 0) {
                *(undefined4 *)((long)&pFVar3->height + uVar10) = 0;
                puVar1 = (undefined8 *)((long)&pFVar3->size + uVar10);
                *puVar1 = 0;
                puVar1[1] = 0;
                *(undefined8 *)((long)&pFVar3->y_ppem + uVar10) = 0;
              }
            }
          }
          pFVar2 = face_00->internal;
          (pFVar2->transform_matrix).xx = 0x10000;
          (pFVar2->transform_matrix).xy = 0;
          (pFVar2->transform_matrix).yx = 0;
          (pFVar2->transform_matrix).yy = 0x10000;
          (pFVar2->transform_delta).x = 0;
          (pFVar2->transform_delta).y = 0;
          pFVar2->refcount = 1;
          pFVar2->no_stem_darkening = -1;
          if (ppFVar19 != (FT_Face_conflict *)0x0) {
            *ppFVar19 = face_00;
            return 0;
          }
          FT_Done_Face(face_00);
          return 0;
        }
        uVar5 = local_38;
        uVar16 = local_38;
        if (node != (FT_ListNode)0x0) {
LAB_001eb100:
          FT_Done_Face(face_00);
          return uVar16;
        }
        goto LAB_001eafab;
      }
    }
  }
  else {
    stream2 = (FT_Stream)0x0;
    face = (FT_Face)0x0;
LAB_001ead61:
    ppFVar19 = local_48;
    pFVar18 = stream;
    stream_00 = local_58;
    local_38 = uVar5;
    if ((((char)uVar5 == '\x02') || ((uVar5 & 0xff) == 0x55)) ||
       (uVar16 = local_34, (uVar5 & 0xff) == 0x51)) {
      if ((char)local_70 != '\0') {
        if (local_58 == (FT_Stream)0x0) {
          uVar5 = 0x55;
LAB_001eadfe:
          if (((ulong)pFVar18->base & 4) != 0) {
            pFVar13 = local_40->memory;
            local_80 = (FT_Stream)0x0;
            FT_Raccess_Guess(local_40,stream_00,(char *)(pFVar18->descriptor).pointer,
                             (char **)&local_118,&local_1d8,(FT_Error *)&args2.params);
            bVar20 = false;
            library_00 = local_40;
            FVar15 = 2;
            for (lVar14 = 0; lVar14 != 0x24; lVar14 = lVar14 + 4) {
              uVar16 = (&ft_raccess_guess_table[0].type)[lVar14] + ~FT_RFork_Rule_darwin_ufs_export;
              FVar7 = FVar15;
              bVar4 = bVar20;
              if (((1 < uVar16) || (!bVar20)) && (*(int *)((long)errors + lVar14 + -8) == 0)) {
                local_188._0_4_ = 4;
                args2.memory_size = *(long *)((long)file_names + lVar14 * 2 + -8);
                if (args2.memory_size == 0) {
                  args2.memory_size = (pFVar18->descriptor).value;
                }
                FVar7 = FT_Stream_New(library_00,(FT_Open_Args *)local_188,&local_80);
                if ((char)FVar7 == 'Q') {
                  bVar4 = true;
                }
                if (1 < uVar16) {
                  bVar4 = bVar20;
                }
                pFVar18 = stream;
                if (FVar7 == 0) {
                  local_70 = local_80;
                  FVar7 = IsMacResource(library_00,local_80,
                                        *(FT_Long *)((long)offsets + lVar14 * 2 + -8),face_index,
                                        local_48);
                  FVar15 = 0;
                  FT_Stream_Free(local_70,0);
                  if (FVar7 == 0) break;
                  library_00 = local_40;
                  pFVar18 = stream;
                  bVar4 = bVar20;
                  if (uVar16 < 2) {
                    bVar4 = true;
                  }
                }
              }
              bVar20 = bVar4;
              FVar15 = FVar7;
            }
            for (lVar14 = 0; lVar14 != 9; lVar14 = lVar14 + 1) {
              if (file_names[lVar14 + -1] != (char *)0x0) {
                (*pFVar13->free)(pFVar13,file_names[lVar14 + -1]);
                file_names[lVar14 + -1] = (char *)0x0;
              }
            }
            if (FVar15 == 0) goto LAB_001eafd0;
            uVar5 = 2;
            goto LAB_001eaf93;
          }
        }
        else {
          uVar5 = FT_Stream_Seek(local_58,0);
          if (uVar5 == 0) {
            uVar5 = FT_Stream_Read(stream_00,(FT_Byte *)&local_118,0x80);
            pFVar18 = stream;
            if (uVar5 != 0) goto LAB_001eadd2;
            if ((((((FT_Byte)local_118 == '\0') && (file_names[8]._2_1_ == '\0')) &&
                 (local_c6 == '\0')) &&
                ((0xde < (byte)(local_118._1_1_ - 0x22) && (file_names[6]._7_1_ == '\0')))) &&
               (-1 < (char)local_c5 &&
                *(FT_Byte *)((long)&local_118 + (ulong)local_118._1_1_ + 2) == '\0')) {
              uVar5 = IsMacResource(local_40,stream_00,
                                    ((ulong)((uint)local_c3 << 8 |
                                            (uint)local_c4 << 0x10 | (uint)local_c5 << 0x18) +
                                     (ulong)local_c2 + 0x7f & 0xffffffffffffff80) + 0x80,face_index,
                                    ppFVar19);
              pFVar18 = stream;
              goto LAB_001eadd2;
            }
LAB_001eadd7:
            uVar5 = IsMacResource(local_40,stream_00,0,face_index,ppFVar19);
          }
          else {
LAB_001eadd2:
            if ((char)uVar5 == '\x02') goto LAB_001eadd7;
          }
          if (((char)uVar5 == 'U') || ((uVar5 & 0xff) == 2)) goto LAB_001eadfe;
        }
        if (uVar5 == 0) {
LAB_001eafd0:
          FT_Stream_Free(stream_00,local_34);
          return 0;
        }
      }
LAB_001eaf93:
      uVar16 = local_34;
      local_38 = uVar5;
      if ((char)uVar5 == '\x02') {
        local_38 = 2;
      }
    }
  }
  uVar5 = local_38;
  FT_Stream_Free(local_58,uVar16);
LAB_001eafab:
  if (local_68 != (FT_Face)0x0) {
    destroy_face((FT_Memory)stream2,local_68,(FT_Driver)face);
    uVar5 = local_38;
  }
  return uVar5;
}

Assistant:

static FT_Error
  ft_open_face_internal( FT_Library           library,
                         const FT_Open_Args*  args,
                         FT_Long              face_index,
                         FT_Face             *aface,
                         FT_Bool              test_mac_fonts )
  {
    FT_Error     error;
    FT_Driver    driver = NULL;
    FT_Memory    memory = NULL;
    FT_Stream    stream = NULL;
    FT_Face      face   = NULL;
    FT_ListNode  node   = NULL;
    FT_Bool      external_stream;
    FT_Module*   cur;
    FT_Module*   limit;

#ifndef FT_CONFIG_OPTION_MAC_FONTS
    FT_UNUSED( test_mac_fonts );
#endif


#ifdef FT_DEBUG_LEVEL_TRACE
    FT_TRACE3(( "FT_Open_Face: " ));
    if ( face_index < 0 )
      FT_TRACE3(( "Requesting number of faces and named instances\n"));
    else
    {
      FT_TRACE3(( "Requesting face %ld", face_index & 0xFFFFL ));
      if ( face_index & 0x7FFF0000L )
        FT_TRACE3(( ", named instance %ld", face_index >> 16 ));
      FT_TRACE3(( "\n" ));
    }
#endif

    /* test for valid `library' delayed to `FT_Stream_New' */

    if ( ( !aface && face_index >= 0 ) || !args )
      return FT_THROW( Invalid_Argument );

    external_stream = FT_BOOL( ( args->flags & FT_OPEN_STREAM ) &&
                               args->stream                     );

    /* create input stream */
    error = FT_Stream_New( library, args, &stream );
    if ( error )
      goto Fail3;

    memory = library->memory;

    /* If the font driver is specified in the `args' structure, use */
    /* it.  Otherwise, we scan the list of registered drivers.      */
    if ( ( args->flags & FT_OPEN_DRIVER ) && args->driver )
    {
      driver = FT_DRIVER( args->driver );

      /* not all modules are drivers, so check... */
      if ( FT_MODULE_IS_DRIVER( driver ) )
      {
        FT_Int         num_params = 0;
        FT_Parameter*  params     = NULL;


        if ( args->flags & FT_OPEN_PARAMS )
        {
          num_params = args->num_params;
          params     = args->params;
        }

        error = open_face( driver, &stream, external_stream, face_index,
                           num_params, params, &face );
        if ( !error )
          goto Success;
      }
      else
        error = FT_THROW( Invalid_Handle );

      FT_Stream_Free( stream, external_stream );
      goto Fail;
    }
    else
    {
      error = FT_ERR( Missing_Module );

      /* check each font driver for an appropriate format */
      cur   = library->modules;
      limit = cur + library->num_modules;

      for ( ; cur < limit; cur++ )
      {
        /* not all modules are font drivers, so check... */
        if ( FT_MODULE_IS_DRIVER( cur[0] ) )
        {
          FT_Int         num_params = 0;
          FT_Parameter*  params     = NULL;


          driver = FT_DRIVER( cur[0] );

          if ( args->flags & FT_OPEN_PARAMS )
          {
            num_params = args->num_params;
            params     = args->params;
          }

          error = open_face( driver, &stream, external_stream, face_index,
                             num_params, params, &face );
          if ( !error )
            goto Success;

#ifdef FT_CONFIG_OPTION_MAC_FONTS
          if ( test_mac_fonts                                           &&
               ft_strcmp( cur[0]->clazz->module_name, "truetype" ) == 0 &&
               FT_ERR_EQ( error, Table_Missing )                        )
          {
            /* TrueType but essential tables are missing */
            error = FT_Stream_Seek( stream, 0 );
            if ( error )
              break;

            error = open_face_PS_from_sfnt_stream( library,
                                                   stream,
                                                   face_index,
                                                   num_params,
                                                   params,
                                                   aface );
            if ( !error )
            {
              FT_Stream_Free( stream, external_stream );
              return error;
            }
          }
#endif

          if ( FT_ERR_NEQ( error, Unknown_File_Format ) )
            goto Fail3;
        }
      }

    Fail3:
      /* If we are on the mac, and we get an                          */
      /* FT_Err_Invalid_Stream_Operation it may be because we have an */
      /* empty data fork, so we need to check the resource fork.      */
      if ( FT_ERR_NEQ( error, Cannot_Open_Stream )       &&
           FT_ERR_NEQ( error, Unknown_File_Format )      &&
           FT_ERR_NEQ( error, Invalid_Stream_Operation ) )
        goto Fail2;

#if !defined( FT_MACINTOSH ) && defined( FT_CONFIG_OPTION_MAC_FONTS )
      if ( test_mac_fonts )
      {
        error = load_mac_face( library, stream, face_index, aface, args );
        if ( !error )
        {
          /* We don't want to go to Success here.  We've already done   */
          /* that.  On the other hand, if we succeeded we still need to */
          /* close this stream (we opened a different stream which      */
          /* extracted the interesting information out of this stream   */
          /* here.  That stream will still be open and the face will    */
          /* point to it).                                              */
          FT_Stream_Free( stream, external_stream );
          return error;
        }
      }

      if ( FT_ERR_NEQ( error, Unknown_File_Format ) )
        goto Fail2;
#endif  /* !FT_MACINTOSH && FT_CONFIG_OPTION_MAC_FONTS */

      /* no driver is able to handle this format */
      error = FT_THROW( Unknown_File_Format );

  Fail2:
      FT_Stream_Free( stream, external_stream );
      goto Fail;
    }

  Success:
    FT_TRACE4(( "FT_Open_Face: New face object, adding to list\n" ));

    /* add the face object to its driver's list */
    if ( FT_NEW( node ) )
      goto Fail;

    node->data = face;
    /* don't assume driver is the same as face->driver, so use */
    /* face->driver instead.                                   */
    FT_List_Add( &face->driver->faces_list, node );

    /* now allocate a glyph slot object for the face */
    FT_TRACE4(( "FT_Open_Face: Creating glyph slot\n" ));

    if ( face_index >= 0 )
    {
      error = FT_New_GlyphSlot( face, NULL );
      if ( error )
        goto Fail;

      /* finally, allocate a size object for the face */
      {
        FT_Size  size;


        FT_TRACE4(( "FT_Open_Face: Creating size object\n" ));

        error = FT_New_Size( face, &size );
        if ( error )
          goto Fail;

        face->size = size;
      }
    }

    /* some checks */

    if ( FT_IS_SCALABLE( face ) )
    {
      if ( face->height < 0 )
        face->height = (FT_Short)-face->height;

      if ( !FT_HAS_VERTICAL( face ) )
        face->max_advance_height = (FT_Short)face->height;
    }

    if ( FT_HAS_FIXED_SIZES( face ) )
    {
      FT_Int  i;


      for ( i = 0; i < face->num_fixed_sizes; i++ )
      {
        FT_Bitmap_Size*  bsize = face->available_sizes + i;


        if ( bsize->height < 0 )
          bsize->height = -bsize->height;
        if ( bsize->x_ppem < 0 )
          bsize->x_ppem = -bsize->x_ppem;
        if ( bsize->y_ppem < 0 )
          bsize->y_ppem = -bsize->y_ppem;

        /* check whether negation actually has worked */
        if ( bsize->height < 0 || bsize->x_ppem < 0 || bsize->y_ppem < 0 )
        {
          FT_TRACE0(( "FT_Open_Face:"
                      " Invalid bitmap dimensions for strike %d,"
                      " now disabled\n", i ));
          bsize->width  = 0;
          bsize->height = 0;
          bsize->size   = 0;
          bsize->x_ppem = 0;
          bsize->y_ppem = 0;
        }
      }
    }

    /* initialize internal face data */
    {
      FT_Face_Internal  internal = face->internal;


      internal->transform_matrix.xx = 0x10000L;
      internal->transform_matrix.xy = 0;
      internal->transform_matrix.yx = 0;
      internal->transform_matrix.yy = 0x10000L;

      internal->transform_delta.x = 0;
      internal->transform_delta.y = 0;

      internal->refcount = 1;

      internal->no_stem_darkening = -1;

#ifdef FT_CONFIG_OPTION_SUBPIXEL_RENDERING
      /* Per-face filtering can only be set up by FT_Face_Properties */
      internal->lcd_filter_func = NULL;
#endif
    }

    if ( aface )
      *aface = face;
    else
      FT_Done_Face( face );

    goto Exit;

  Fail:
    if ( node )
      FT_Done_Face( face );    /* face must be in the driver's list */
    else if ( face )
      destroy_face( memory, face, driver );

  Exit:
#ifdef FT_DEBUG_LEVEL_TRACE
    if ( !error && face_index < 0 )
    {
      FT_TRACE3(( "FT_Open_Face: The font has %ld face%s\n"
                  "              and %ld named instance%s for face %ld\n",
                  face->num_faces,
                  face->num_faces == 1 ? "" : "s",
                  face->style_flags >> 16,
                  ( face->style_flags >> 16 ) == 1 ? "" : "s",
                  -face_index - 1 ));
    }
#endif

    FT_TRACE4(( "FT_Open_Face: Return 0x%x\n", error ));

    return error;
  }